

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  long lVar1;
  bool bVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    if (in_RCX == 0) {
      (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
      break;
    }
    sVar3 = write(*(int *)(data + 0x10010),(void *)size,in_RCX);
    if (sVar3 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 == 4) goto LAB_0066648b;
      PosixError((anon_unknown_1 *)this,(string *)(data + 0x10018),*piVar4);
      bVar2 = true;
    }
    else {
      size = size + sVar3;
      in_RCX = in_RCX - sVar3;
LAB_0066648b:
      bVar2 = false;
    }
  } while (!bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }